

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_GateToType(Abc_Obj_t *pObj)

{
  int iVar1;
  char *__s1;
  char *pGateName;
  Abc_Obj_t *pObj_local;
  
  __s1 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
  iVar1 = strncmp(__s1,"buf",3);
  if (iVar1 == 0) {
    pObj_local._4_4_ = 0xb;
  }
  else {
    iVar1 = strncmp(__s1,"inv",3);
    if (iVar1 == 0) {
      pObj_local._4_4_ = 0xc;
    }
    else {
      iVar1 = strncmp(__s1,"and",3);
      if (iVar1 == 0) {
        pObj_local._4_4_ = 0xd;
      }
      else {
        iVar1 = strncmp(__s1,"nand",4);
        if (iVar1 == 0) {
          pObj_local._4_4_ = 0xe;
        }
        else {
          iVar1 = strncmp(__s1,"or",2);
          if (iVar1 == 0) {
            pObj_local._4_4_ = 0xf;
          }
          else {
            iVar1 = strncmp(__s1,"nor",3);
            if (iVar1 == 0) {
              pObj_local._4_4_ = 0x10;
            }
            else {
              iVar1 = strncmp(__s1,"xor",3);
              if (iVar1 == 0) {
                pObj_local._4_4_ = 0x11;
              }
              else {
                iVar1 = strncmp(__s1,"xnor",4);
                if (iVar1 == 0) {
                  pObj_local._4_4_ = 0x12;
                }
                else {
                  iVar1 = strncmp(__s1,"zero",4);
                  if (iVar1 == 0) {
                    pObj_local._4_4_ = 7;
                  }
                  else {
                    iVar1 = strncmp(__s1,"one",3);
                    if (iVar1 != 0) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                                    ,0xc2a,"int Abc_GateToType(Abc_Obj_t *)");
                    }
                    pObj_local._4_4_ = 8;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_GateToType( Abc_Obj_t * pObj )
{
    char * pGateName = Mio_GateReadName((Mio_Gate_t *)pObj->pData);
    if ( !strncmp(pGateName, "buf",  3) )  return ABC_OPER_BIT_BUF;
    if ( !strncmp(pGateName, "inv",  3) )  return ABC_OPER_BIT_INV;
    if ( !strncmp(pGateName, "and",  3) )  return ABC_OPER_BIT_AND;
    if ( !strncmp(pGateName, "nand", 4) )  return ABC_OPER_BIT_NAND;
    if ( !strncmp(pGateName, "or",   2) )  return ABC_OPER_BIT_OR;
    if ( !strncmp(pGateName, "nor",  3) )  return ABC_OPER_BIT_NOR;
    if ( !strncmp(pGateName, "xor",  3) )  return ABC_OPER_BIT_XOR;
    if ( !strncmp(pGateName, "xnor", 4) )  return ABC_OPER_BIT_NXOR;
    if ( !strncmp(pGateName, "zero", 4) )  return ABC_OPER_CONST_F;
    if ( !strncmp(pGateName, "one",  3) )  return ABC_OPER_CONST_T;
    assert( 0 );
    return -1;
}